

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O3

ssize_t gzip_filter_read(archive_read_filter *self,void **p)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  int iVar4;
  ssize_t request;
  undefined8 uVar5;
  void *pvVar6;
  long lVar7;
  char *fmt;
  int64_t request_00;
  archive_read_filter *filter;
  archive_read *a;
  ssize_t avail_in;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  
  puVar1 = (undefined8 *)self->data;
  puVar1[3] = puVar1[0xf];
  *(int *)(puVar1 + 4) = *(int *)(puVar1 + 0x10);
  if (*(int *)(puVar1 + 0x10) != 0) {
    do {
      if (*(char *)(puVar1 + 0x13) != '\0') break;
      if (*(char *)(puVar1 + 0xe) == '\0') {
        puVar2 = (undefined8 *)self->data;
        request = peek_at_header(self->upstream,(int *)0x0);
        if (request != 0) {
          __archive_read_filter_consume(self->upstream,request);
          uVar5 = crc32(0,0,0);
          puVar2[0x12] = uVar5;
          pvVar6 = __archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_38);
          *puVar2 = pvVar6;
          *(undefined4 *)(puVar2 + 1) = local_38;
          uVar3 = inflateInit2_(puVar2,0xfffffff1,"1.2.11",0x70);
          if (uVar3 == 0) {
            *(undefined1 *)(puVar2 + 0xe) = 1;
            goto LAB_0011a948;
          }
          if (uVar3 == 0xfffffffa) {
            a = self->archive;
            fmt = "Internal error initializing compression library: invalid library version";
          }
          else {
            if (uVar3 == 0xfffffffc) {
              a = self->archive;
              fmt = "Internal error initializing compression library: out of memory";
              iVar4 = 0xc;
              goto LAB_0011aa7e;
            }
            if (uVar3 != 0xfffffffe) {
              archive_set_error(&self->archive->archive,-1,
                                "Internal error initializing compression library:  Zlib error %d",
                                (ulong)uVar3);
              return -0x1e;
            }
            a = self->archive;
            fmt = "Internal error initializing compression library: invalid setup parameter";
          }
LAB_0011aa79:
          iVar4 = -1;
LAB_0011aa7e:
          archive_set_error(&a->archive,iVar4,fmt);
          return -0x1e;
        }
        *(undefined1 *)(puVar1 + 0x13) = 1;
        break;
      }
LAB_0011a948:
      pvVar6 = __archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_40);
      *puVar1 = pvVar6;
      if (pvVar6 == (void *)0x0) {
        a = self->archive;
        fmt = "truncated gzip input";
        goto LAB_0011aa79;
      }
      *(undefined4 *)(puVar1 + 1) = local_40;
      iVar4 = inflate(puVar1,0);
      if (iVar4 == 1) {
        __archive_read_filter_consume
                  (self->upstream,CONCAT44(uStack_3c,local_40) - (ulong)*(uint *)(puVar1 + 1));
        *(undefined1 *)((long)self->data + 0x70) = 0;
        iVar4 = inflateEnd();
        if (iVar4 != 0) {
          a = self->archive;
          fmt = "Failed to clean up gzip decompressor";
          goto LAB_0011aa79;
        }
        pvVar6 = __archive_read_filter_ahead(self->upstream,8,(ssize_t *)&local_38);
        if (pvVar6 == (void *)0x0) {
          return -0x1e;
        }
        if (CONCAT44(uStack_34,local_38) == 0) {
          return -0x1e;
        }
        filter = self->upstream;
        request_00 = 8;
      }
      else {
        if (iVar4 != 0) {
          a = self->archive;
          fmt = "gzip decompression failed";
          goto LAB_0011aa79;
        }
        filter = self->upstream;
        request_00 = CONCAT44(uStack_3c,local_40) - (ulong)*(uint *)(puVar1 + 1);
      }
      __archive_read_filter_consume(filter,request_00);
    } while (*(int *)(puVar1 + 4) != 0);
  }
  pvVar6 = (void *)puVar1[0xf];
  lVar7 = puVar1[3] - (long)pvVar6;
  puVar1[0x11] = puVar1[0x11] + lVar7;
  if (lVar7 == 0) {
    pvVar6 = (void *)0x0;
  }
  *p = pvVar6;
  return lVar7;
}

Assistant:

static ssize_t
gzip_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	int ret;

	state = (struct private_data *)self->data;

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = (uInt)state->out_block_size;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		/* If we're not in a stream, read a header
		 * and initialize the decompression library. */
		if (!state->in_stream) {
			ret = consume_header(self);
			if (ret == ARCHIVE_EOF) {
				state->eof = 1;
				break;
			}
			if (ret < ARCHIVE_OK)
				return (ret);
		}

		/* Peek at the next available data. */
		/* ZLib treats stream.next_in as const but doesn't declare
		 * it so, hence this ugly cast. */
		state->stream.next_in = (unsigned char *)(uintptr_t)
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated gzip input");
			return (ARCHIVE_FATAL);
		}
		state->stream.avail_in = (uInt)avail_in;

		/* Decompress and consume some of that data. */
		ret = inflate(&(state->stream), 0);
		switch (ret) {
		case Z_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			break;
		case Z_STREAM_END: /* Found end of stream. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			/* Consume the stream trailer; release the
			 * decompression library. */
			ret = consume_trailer(self);
			if (ret < ARCHIVE_OK)
				return (ret);
			break;
		default:
			/* Return an error. */
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "gzip decompression failed");
			return (ARCHIVE_FATAL);
		}
	}

	/* We've read as much as we can. */
	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else
		*p = state->out_block;
	return (decompressed);
}